

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3LeaveMutexAndCloseZombie(sqlite3 *db)

{
  int iVar1;
  long lVar2;
  long in_RDI;
  Module *pMod;
  CollSeq *pColl;
  FuncDef *p;
  FuncDef *pNext;
  Db *pDb;
  int j;
  HashElem *i;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  sqlite3 *in_stack_ffffffffffffffc0;
  sqlite3 *in_stack_ffffffffffffffc8;
  sqlite3 *in_stack_ffffffffffffffd0;
  int local_14;
  undefined8 *local_10;
  
  if ((*(char *)(in_RDI + 0x71) == -0x59) &&
     (iVar1 = connectionIsBusy(in_stack_ffffffffffffffc8), iVar1 == 0)) {
    sqlite3RollbackAll(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    sqlite3CloseSavepoints(in_stack_ffffffffffffffc0);
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x28); local_14 = local_14 + 1) {
      lVar2 = *(long *)(in_RDI + 0x20) + (long)local_14 * 0x20;
      if (*(long *)(lVar2 + 8) != 0) {
        sqlite3BtreeClose((Btree *)in_stack_ffffffffffffffc0);
        *(undefined8 *)(lVar2 + 8) = 0;
        if (local_14 != 1) {
          *(undefined8 *)(lVar2 + 0x18) = 0;
        }
      }
    }
    if (*(long *)(*(long *)(in_RDI + 0x20) + 0x38) != 0) {
      sqlite3SchemaClear(in_stack_ffffffffffffffc8);
    }
    sqlite3VtabUnlockList(in_stack_ffffffffffffffc0);
    sqlite3CollapseDatabaseArray(in_stack_ffffffffffffffc0);
    for (local_10 = *(undefined8 **)(in_RDI + 600); local_10 != (undefined8 *)0x0;
        local_10 = (undefined8 *)*local_10) {
      lVar2 = local_10[2];
      do {
        functionDestroy(in_stack_ffffffffffffffc0,
                        (FuncDef *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        lVar2 = *(long *)(lVar2 + 0x10);
        sqlite3DbFree(in_stack_ffffffffffffffc0,
                      (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      } while (lVar2 != 0);
    }
    sqlite3HashClear((Hash *)in_stack_ffffffffffffffc0);
    for (local_10 = *(undefined8 **)(in_RDI + 0x270); local_10 != (undefined8 *)0x0;
        local_10 = (undefined8 *)*local_10) {
      lVar2 = local_10[2];
      for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
        if (*(long *)(lVar2 + (long)local_14 * 0x28 + 0x20) != 0) {
          (**(code **)(lVar2 + (long)local_14 * 0x28 + 0x20))
                    (*(undefined8 *)(lVar2 + (long)local_14 * 0x28 + 0x10));
        }
      }
      sqlite3DbFree(in_stack_ffffffffffffffc0,
                    (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    sqlite3HashClear((Hash *)in_stack_ffffffffffffffc0);
    for (local_10 = *(undefined8 **)(in_RDI + 0x228); local_10 != (undefined8 *)0x0;
        local_10 = (undefined8 *)*local_10) {
      in_stack_ffffffffffffffc0 = (sqlite3 *)local_10[2];
      sqlite3VtabEponymousTableClear
                (in_stack_ffffffffffffffc0,
                 (Module *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      sqlite3VtabModuleUnref
                (in_stack_ffffffffffffffc0,
                 (Module *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    sqlite3HashClear((Hash *)in_stack_ffffffffffffffc0);
    sqlite3Error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    sqlite3ValueFree((sqlite3_value *)0x13d7c3);
    sqlite3CloseExtensions(in_stack_ffffffffffffffc0);
    *(undefined1 *)(in_RDI + 0x71) = 0xd5;
    sqlite3DbFree(in_stack_ffffffffffffffc0,
                  (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (*(long *)(in_RDI + 0x148) != 0) {
      (**(code **)(in_RDI + 0x148))(*(undefined8 *)(in_RDI + 0x140));
    }
    sqlite3_mutex_leave((sqlite3_mutex *)0x13d824);
    *(undefined1 *)(in_RDI + 0x71) = 0xce;
    sqlite3_mutex_free((sqlite3_mutex *)0x13d83b);
    if (*(char *)(in_RDI + 0x1a0) != '\0') {
      sqlite3_free((void *)0x13d85a);
    }
    sqlite3_free((void *)0x13d864);
  }
  else {
    sqlite3_mutex_leave((sqlite3_mutex *)0x13d50d);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3LeaveMutexAndCloseZombie(sqlite3 *db){
  HashElem *i;                    /* Hash table iterator */
  int j;

  /* If there are outstanding sqlite3_stmt or sqlite3_backup objects
  ** or if the connection has not yet been closed by sqlite3_close_v2(),
  ** then just leave the mutex and return.
  */
  if( db->eOpenState!=SQLITE_STATE_ZOMBIE || connectionIsBusy(db) ){
    sqlite3_mutex_leave(db->mutex);
    return;
  }

  /* If we reach this point, it means that the database connection has
  ** closed all sqlite3_stmt and sqlite3_backup objects and has been
  ** passed to sqlite3_close (meaning that it is a zombie).  Therefore,
  ** go ahead and free all resources.
  */

  /* If a transaction is open, roll it back. This also ensures that if
  ** any database schemas have been modified by an uncommitted transaction
  ** they are reset. And that the required b-tree mutex is held to make
  ** the pager rollback and schema reset an atomic operation. */
  sqlite3RollbackAll(db, SQLITE_OK);

  /* Free any outstanding Savepoint structures. */
  sqlite3CloseSavepoints(db);

  /* Close all database connections */
  for(j=0; j<db->nDb; j++){
    struct Db *pDb = &db->aDb[j];
    if( pDb->pBt ){
      sqlite3BtreeClose(pDb->pBt);
      pDb->pBt = 0;
      if( j!=1 ){
        pDb->pSchema = 0;
      }
    }
  }
  /* Clear the TEMP schema separately and last */
  if( db->aDb[1].pSchema ){
    sqlite3SchemaClear(db->aDb[1].pSchema);
  }
  sqlite3VtabUnlockList(db);

  /* Free up the array of auxiliary databases */
  sqlite3CollapseDatabaseArray(db);
  assert( db->nDb<=2 );
  assert( db->aDb==db->aDbStatic );

  /* Tell the code in notify.c that the connection no longer holds any
  ** locks and does not require any further unlock-notify callbacks.
  */
  sqlite3ConnectionClosed(db);

  for(i=sqliteHashFirst(&db->aFunc); i; i=sqliteHashNext(i)){
    FuncDef *pNext, *p;
    p = sqliteHashData(i);
    do{
      functionDestroy(db, p);
      pNext = p->pNext;
      sqlite3DbFree(db, p);
      p = pNext;
    }while( p );
  }
  sqlite3HashClear(&db->aFunc);
  for(i=sqliteHashFirst(&db->aCollSeq); i; i=sqliteHashNext(i)){
    CollSeq *pColl = (CollSeq *)sqliteHashData(i);
    /* Invoke any destructors registered for collation sequence user data. */
    for(j=0; j<3; j++){
      if( pColl[j].xDel ){
        pColl[j].xDel(pColl[j].pUser);
      }
    }
    sqlite3DbFree(db, pColl);
  }
  sqlite3HashClear(&db->aCollSeq);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  for(i=sqliteHashFirst(&db->aModule); i; i=sqliteHashNext(i)){
    Module *pMod = (Module *)sqliteHashData(i);
    sqlite3VtabEponymousTableClear(db, pMod);
    sqlite3VtabModuleUnref(db, pMod);
  }
  sqlite3HashClear(&db->aModule);
#endif

  sqlite3Error(db, SQLITE_OK); /* Deallocates any cached error strings. */
  sqlite3ValueFree(db->pErr);
  sqlite3CloseExtensions(db);

  db->eOpenState = SQLITE_STATE_ERROR;

  /* The temp-database schema is allocated differently from the other schema
  ** objects (using sqliteMalloc() directly, instead of sqlite3BtreeSchema()).
  ** So it needs to be freed here. Todo: Why not roll the temp schema into
  ** the same sqliteMalloc() as the one that allocates the database
  ** structure?
  */
  sqlite3DbFree(db, db->aDb[1].pSchema);
  if( db->xAutovacDestr ){
    db->xAutovacDestr(db->pAutovacPagesArg);
  }
  sqlite3_mutex_leave(db->mutex);
  db->eOpenState = SQLITE_STATE_CLOSED;
  sqlite3_mutex_free(db->mutex);
  assert( sqlite3LookasideUsed(db,0)==0 );
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  sqlite3_free(db);
}